

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atomreg_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *expr;
  int iVar1;
  matches *res;
  easm_expr *e;
  reg *reg;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  if ((spos == ctx->atomsnum) || (ctx->atoms[spos]->type != LITEM_EXPR)) {
    ctx_local = (iasctx *)0x0;
  }
  else {
    expr = ctx->atoms[spos]->expr;
    ctx_local = (iasctx *)alwaysmatches(spos + 1);
    iVar1 = matchreg((match *)ctx_local->isa,(reg *)v,expr,ctx);
    if (iVar1 == 0) {
      free((match *)ctx_local->isa);
      free(ctx_local);
      ctx_local = (iasctx *)0x0;
    }
  }
  return (matches *)ctx_local;
}

Assistant:

struct matches *atomreg_a APROTO {
	const struct reg *reg = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	struct matches *res = alwaysmatches(spos+1);
	if (matchreg(res->m, reg, e, ctx))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}